

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

StackSym * __thiscall GlobOpt::EnsureObjectTypeSym(GlobOpt *this,StackSym *objectSym)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  ObjectSymInfo *pOVar7;
  
  if ((objectSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2e7,"(!objectSym->IsTypeSpec())","!objectSym->IsTypeSpec()");
    if (!bVar3) goto LAB_0046b986;
    *puVar4 = 0;
  }
  StackSym::EnsureObjectInfo(objectSym,this->func);
  bVar3 = StackSym::HasObjectTypeSym(objectSym);
  if (!bVar3) {
    if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
               new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
      pJVar1 = this->alloc;
      pBVar6->head = (Type_conflict)0x0;
      pBVar6->lastFoundIndex = (Type_conflict)0x0;
      pBVar6->alloc = pJVar1;
      pBVar6->lastUsedNodePrevNextField = (Type)pBVar6;
      this->objectTypeSyms = pBVar6;
    }
    pSVar5 = StackSym::New(TyVar,this->func);
    pOVar7 = StackSym::GetObjectInfo(objectSym);
    pOVar7->m_typeSym = pSVar5;
    BVSparse<Memory::JitArenaAllocator>::Set(this->objectTypeSyms,(pSVar5->super_Sym).m_id);
    return pSVar5;
  }
  if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2ed,"(this->objectTypeSyms)","this->objectTypeSyms");
    if (!bVar3) {
LAB_0046b986:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = StackSym::GetObjectTypeSym(objectSym);
  return pSVar5;
}

Assistant:

StackSym *
GlobOpt::EnsureObjectTypeSym(StackSym * objectSym)
{
    Assert(!objectSym->IsTypeSpec());

    objectSym->EnsureObjectInfo(this->func);

    if (objectSym->HasObjectTypeSym())
    {
        Assert(this->objectTypeSyms);
        return objectSym->GetObjectTypeSym();
    }

    if (this->objectTypeSyms == nullptr)
    {
        this->objectTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    }

    StackSym * typeSym = StackSym::New(TyVar, this->func);

    objectSym->GetObjectInfo()->m_typeSym = typeSym;

    this->objectTypeSyms->Set(typeSym->m_id);

    return typeSym;
}